

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

int proxy_h2_on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  long lVar1;
  int iVar2;
  Curl_easy *local_158;
  char local_148 [4];
  int len;
  char buffer [256];
  int32_t stream_id;
  Curl_easy *data;
  cf_h2_proxy_ctx *ctx;
  Curl_cfilter *cf;
  void *userp_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  lVar1 = *(long *)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    local_158 = (Curl_easy *)0x0;
  }
  else {
    local_158 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 8);
  }
  buffer._252_4_ = (frame->hd).stream_id;
  if ((((local_158 != (Curl_easy *)0x0) &&
       ((*(ulong *)&(local_158->set).field_0x8ba >> 0x1c & 1) != 0)) && (userp != (void *)0x0)) &&
     (0 < *(int *)(*userp + 0xc))) {
    iVar2 = proxy_h2_fr_print(frame,local_148,0xff);
    local_148[iVar2] = '\0';
    if (((local_158 != (Curl_easy *)0x0) &&
        ((*(ulong *)&(local_158->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
      Curl_trc_cf_infof(local_158,(Curl_cfilter *)userp,"[%d] <- %s",
                        (ulong)(uint)(frame->hd).stream_id,local_148);
    }
  }
  if (buffer._252_4_ == 0) {
    if ((frame->hd).type == '\x04') {
      if (((local_158->req).keepon & 0x2aU) == 2) {
        drain_tunnel((Curl_cfilter *)userp,local_158,(tunnel_stream *)(lVar1 + 0x90));
      }
    }
    else if ((frame->hd).type == '\a') {
      *(byte *)(lVar1 + 0x140) = *(byte *)(lVar1 + 0x140) & 0xfd | 2;
    }
    session_local._4_4_ = 0;
  }
  else if (buffer._252_4_ == *(int *)(lVar1 + 0x120)) {
    if ((frame->hd).type == '\x01') {
      if (*(long *)(lVar1 + 0x90) == 0) {
        return -0x386;
      }
      if (((local_158 != (Curl_easy *)0x0) &&
          ((*(ulong *)&(local_158->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
        Curl_trc_cf_infof(local_158,(Curl_cfilter *)userp,"[%d] got http status: %d",
                          (ulong)(uint)buffer._252_4_,(ulong)**(uint **)(lVar1 + 0x90));
      }
      if (((*(byte *)(lVar1 + 0x134) & 1) == 0) && (**(int **)(lVar1 + 0x90) / 100 != 1)) {
        *(byte *)(lVar1 + 0x134) = *(byte *)(lVar1 + 0x134) & 0xfe | 1;
      }
    }
    else if (((frame->hd).type == '\b') && (((local_158->req).keepon & 0x2aU) == 2)) {
      drain_tunnel((Curl_cfilter *)userp,local_158,(tunnel_stream *)(lVar1 + 0x90));
    }
    session_local._4_4_ = 0;
  }
  else {
    if ((((local_158 != (Curl_easy *)0x0) &&
         ((*(ulong *)&(local_158->set).field_0x8ba >> 0x1c & 1) != 0)) && (userp != (void *)0x0)) &&
       (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(local_158,(Curl_cfilter *)userp,"[%d] rcvd FRAME not for tunnel",
                        (ulong)(uint)buffer._252_4_);
    }
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int proxy_h2_on_frame_recv(nghttp2_session *session,
                                  const nghttp2_frame *frame,
                                  void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  int32_t stream_id = frame->hd.stream_id;

  (void)session;
  DEBUGASSERT(data);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  if(Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = proxy_h2_fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] <- %s",frame->hd.stream_id, buffer);
  }
#endif /* !CURL_DISABLE_VERBOSE_STRINGS */

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    DEBUGASSERT(data);
    switch(frame->hd.type) {
    case NGHTTP2_SETTINGS:
      /* Since the initial stream window is 64K, a request might be on HOLD,
       * due to exhaustion. The (initial) SETTINGS may announce a much larger
       * window and *assume* that we treat this like a WINDOW_UPDATE. Some
       * servers send an explicit WINDOW_UPDATE, but not all seem to do that.
       * To be safe, we UNHOLD a stream in order not to stall. */
      if(CURL_WANT_SEND(data)) {
        drain_tunnel(cf, data, &ctx->tunnel);
      }
      break;
    case NGHTTP2_GOAWAY:
      ctx->goaway = TRUE;
      break;
    default:
      break;
    }
    return 0;
  }

  if(stream_id != ctx->tunnel.stream_id) {
    CURL_TRC_CF(data, cf, "[%d] rcvd FRAME not for tunnel", stream_id);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  switch(frame->hd.type) {
  case NGHTTP2_HEADERS:
    /* nghttp2 guarantees that :status is received, and we store it to
       stream->status_code. Fuzzing has proven this can still be reached
       without status code having been set. */
    if(!ctx->tunnel.resp)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* Only final status code signals the end of header */
    CURL_TRC_CF(data, cf, "[%d] got http status: %d",
                stream_id, ctx->tunnel.resp->status);
    if(!ctx->tunnel.has_final_response) {
      if(ctx->tunnel.resp->status / 100 != 1) {
        ctx->tunnel.has_final_response = TRUE;
      }
    }
    break;
  case NGHTTP2_WINDOW_UPDATE:
    if(CURL_WANT_SEND(data)) {
      drain_tunnel(cf, data, &ctx->tunnel);
    }
    break;
  default:
    break;
  }
  return 0;
}